

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

shared_ptr<chrono::ChLinkLockRevolute> __thiscall
chrono::curiosity::AddRevoluteJoint
          (curiosity *this,shared_ptr<chrono::ChBodyAuxRef> *body_1,
          shared_ptr<chrono::ChBodyAuxRef> *body_2,
          shared_ptr<chrono::curiosity::CuriosityChassis> *chassis,ChVector<double> *rel_joint_pos,
          ChQuaternion<double> *rel_joint_rot)

{
  double dVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long *plVar5;
  long lVar6;
  ChFrame<double> *this_00;
  ChLinkLockRevolute *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  shared_ptr<chrono::ChLinkLockRevolute> sVar10;
  ChFrame<double> X_GC;
  undefined8 local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  element_type *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  shared_ptr<chrono::curiosity::CuriosityChassis> *local_188;
  shared_ptr<chrono::ChBodyAuxRef> *local_180;
  ChFrame<double> local_178;
  double local_f0;
  double dStack_e8;
  double dStack_e0;
  double dStack_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  undefined1 local_b8 [40];
  double local_90;
  double dStack_88;
  double local_80;
  ChMatrix33<double> local_78;
  
  peVar2 = (chassis->
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_188 = chassis;
  local_180 = body_2;
  this_00 = (ChFrame<double> *)(**(code **)(*(long *)peVar3 + 0x1f0))();
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_b8._0_8_ = &PTR__ChFrame_0017db90;
  dVar1 = rel_joint_pos->m_data[2];
  auVar8._8_8_ = dVar1;
  auVar8._0_8_ = dVar1;
  auVar8._16_8_ = dVar1;
  auVar8._24_8_ = dVar1;
  auVar8 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])rel_joint_pos->m_data),auVar8,0x30);
  dVar1 = rel_joint_rot->m_data[0];
  auVar9._8_8_ = dVar1;
  auVar9._0_8_ = dVar1;
  auVar9._16_8_ = dVar1;
  auVar9._24_8_ = dVar1;
  local_b8._8_32_ = vblendps_avx(auVar8,auVar9,0xc0);
  local_90 = rel_joint_rot->m_data[1];
  dStack_88 = rel_joint_rot->m_data[2];
  local_80 = rel_joint_rot->m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_78,rel_joint_rot);
  ChFrame<double>::operator*(&local_178,this_00,(ChFrame<double> *)local_b8);
  this_01 = (ChLinkLockRevolute *)ChLinkLock::operator_new((ChLinkLock *)0xe90,(size_t)this_00);
  ChLinkLockRevolute::ChLinkLockRevolute(this_01);
  *(ChLinkLockRevolute **)this = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChLinkLockRevolute*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),this_01);
  local_198 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Stack_190 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  p_Var4 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  plVar5 = *(long **)this;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_1a8 = (local_180->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  p_Stack_1a0 = (local_180->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  p_Var4 = (local_180->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_f0 = local_178.coord.pos.m_data[0];
  dStack_e8 = local_178.coord.pos.m_data[1];
  dStack_e0 = local_178.coord.pos.m_data[2];
  dStack_d8 = local_178.coord.rot.m_data[0];
  local_d0 = local_178.coord.rot.m_data[1];
  dStack_c8 = local_178.coord.rot.m_data[2];
  local_c0 = local_178.coord.rot.m_data[3];
  (**(code **)(*plVar5 + 0x250))(plVar5,&local_198,&local_1a8);
  if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
  }
  if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
  }
  peVar2 = (local_188->
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar2->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_1b8 = *(undefined8 *)this;
  p_Stack_1b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  plVar5 = *(long **)(peVar3 + 0x38);
  lVar6 = *(long *)(this + 8);
  if (lVar6 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
    }
  }
  (**(code **)(*plVar5 + 0x138))(plVar5,&local_1b8);
  _Var7._M_pi = extraout_RDX;
  if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    _Var7._M_pi = extraout_RDX_01;
  }
  sVar10.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  sVar10.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkLockRevolute>)
         sVar10.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkLockRevolute> AddRevoluteJoint(std::shared_ptr<ChBodyAuxRef> body_1,
                                                     std::shared_ptr<ChBodyAuxRef> body_2,
                                                     std::shared_ptr<CuriosityChassis> chassis,
                                                     const ChVector<>& rel_joint_pos,
                                                     const ChQuaternion<>& rel_joint_rot) {
    const ChFrame<>& X_GP = chassis->GetBody()->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);                       // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                                       // global -> child

    auto joint = chrono_types::make_shared<ChLinkLockRevolute>();
    joint->Initialize(body_1, body_2, ChCoordsys<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    chassis->GetBody()->GetSystem()->AddLink(joint);

    return joint;
}